

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<QByteArray,_QByteArray>::~QStringBuilder
          (QStringBuilder<QByteArray,_QByteArray> *this)

{
  QByteArray::~QByteArray((QByteArray *)0x182130);
  QByteArray::~QByteArray((QByteArray *)0x18213a);
  return;
}

Assistant:

~QStringBuilder() = default;